

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

void test_key_exchanges(void)

{
  test_key_exchange(&ptls_openssl_secp256r1,&ptls_openssl_secp256r1);
  test_key_exchange(&ptls_openssl_secp256r1,&ptls_minicrypto_secp256r1);
  test_key_exchange(&ptls_minicrypto_secp256r1,&ptls_openssl_secp256r1);
  test_key_exchange(&ptls_openssl_secp384r1,&ptls_openssl_secp384r1);
  test_key_exchange(&ptls_openssl_secp521r1,&ptls_openssl_secp521r1);
  test_key_exchange(&ptls_openssl_x25519,&ptls_openssl_x25519);
  test_key_exchange(&ptls_openssl_x25519,&ptls_minicrypto_x25519);
  test_key_exchange(&ptls_minicrypto_x25519,&ptls_openssl_x25519);
  return;
}

Assistant:

static void test_key_exchanges(void)
{
    test_key_exchange(&ptls_openssl_secp256r1, &ptls_openssl_secp256r1);
    test_key_exchange(&ptls_openssl_secp256r1, &ptls_minicrypto_secp256r1);
    test_key_exchange(&ptls_minicrypto_secp256r1, &ptls_openssl_secp256r1);

#if PTLS_OPENSSL_HAVE_SECP384R1
    test_key_exchange(&ptls_openssl_secp384r1, &ptls_openssl_secp384r1);
#endif

#if PTLS_OPENSSL_HAVE_SECP521R1
    test_key_exchange(&ptls_openssl_secp521r1, &ptls_openssl_secp521r1);
#endif

#if PTLS_OPENSSL_HAVE_X25519
    test_key_exchange(&ptls_openssl_x25519, &ptls_openssl_x25519);
    test_key_exchange(&ptls_openssl_x25519, &ptls_minicrypto_x25519);
    test_key_exchange(&ptls_minicrypto_x25519, &ptls_openssl_x25519);
#endif
}